

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall Catch::XmlReporter::benchmarkPreparing(XmlReporter *this,StringRef name)

{
  StringRef attribute;
  XmlFormatting fmt;
  XmlWriter *this_00;
  StringRef name_00;
  allocator<char> local_41;
  string local_40;
  XmlReporter *local_20;
  XmlReporter *this_local;
  StringRef name_local;
  
  name_local.m_start = (char *)name.m_size;
  this_local = (XmlReporter *)name.m_start;
  local_20 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"BenchmarkResults",&local_41);
  fmt = operator|(Newline,Indent);
  this_00 = XmlWriter::startElement(&this->m_xml,&local_40,fmt);
  name_00 = operator____sr("name",4);
  attribute.m_size = (size_type)name_local.m_start;
  attribute.m_start = (char *)this_local;
  XmlWriter::writeAttribute(this_00,name_00,attribute);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  return;
}

Assistant:

void XmlReporter::benchmarkPreparing( StringRef name ) {
        m_xml.startElement("BenchmarkResults")
             .writeAttribute("name"_sr, name);
    }